

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# escape.c
# Opt level: O1

char * curl_easy_escape(Curl_easy *data,char *string,int inlength)

{
  byte in;
  bool bVar1;
  _Bool _Var2;
  size_t sVar3;
  char *ptr;
  char *pcVar4;
  long lVar5;
  long lVar6;
  ulong local_40;
  size_t local_38;
  
  if (-1 < inlength) {
    if (inlength == 0) {
      sVar3 = strlen(string);
    }
    else {
      sVar3 = (size_t)(uint)inlength;
    }
    local_40 = sVar3 + 1;
    ptr = (char *)(*Curl_cmalloc)(local_40);
    if (ptr != (char *)0x0) {
      lVar6 = sVar3 + 1;
      lVar5 = 0;
      local_38 = local_40;
      do {
        lVar6 = lVar6 + -1;
        if (lVar6 == 0) {
          ptr[lVar5] = '\0';
          return ptr;
        }
        in = *string;
        _Var2 = Curl_isunreserved(in);
        pcVar4 = ptr;
        if (_Var2) {
          ptr[lVar5] = in;
          lVar5 = lVar5 + 1;
LAB_0011f2ca:
          string = (char *)((byte *)string + 1);
          bVar1 = true;
          ptr = pcVar4;
        }
        else {
          local_38 = local_38 + 2;
          if (local_38 <= local_40) {
LAB_0011f2ad:
            curl_msnprintf(pcVar4 + lVar5,4,"%%%02X",(ulong)in);
            lVar5 = lVar5 + 3;
            goto LAB_0011f2ca;
          }
          local_40 = local_40 * 2;
          pcVar4 = (char *)Curl_saferealloc(ptr,local_40);
          if (pcVar4 != (char *)0x0) goto LAB_0011f2ad;
          bVar1 = false;
        }
      } while (bVar1);
    }
  }
  return (char *)0x0;
}

Assistant:

char *curl_easy_escape(struct Curl_easy *data, const char *string,
                       int inlength)
{
  size_t alloc;
  char *ns;
  char *testing_ptr = NULL;
  size_t newlen;
  size_t strindex = 0;
  size_t length;
  CURLcode result;

  if(inlength < 0)
    return NULL;

  alloc = (inlength?(size_t)inlength:strlen(string)) + 1;
  newlen = alloc;

  ns = malloc(alloc);
  if(!ns)
    return NULL;

  length = alloc-1;
  while(length--) {
    unsigned char in = *string; /* we need to treat the characters unsigned */

    if(Curl_isunreserved(in))
      /* just copy this */
      ns[strindex++] = in;
    else {
      /* encode it */
      newlen += 2; /* the size grows with two, since this'll become a %XX */
      if(newlen > alloc) {
        alloc *= 2;
        testing_ptr = Curl_saferealloc(ns, alloc);
        if(!testing_ptr)
          return NULL;
        ns = testing_ptr;
      }

      result = Curl_convert_to_network(data, (char *)&in, 1);
      if(result) {
        /* Curl_convert_to_network calls failf if unsuccessful */
        free(ns);
        return NULL;
      }

      msnprintf(&ns[strindex], 4, "%%%02X", in);

      strindex += 3;
    }
    string++;
  }
  ns[strindex] = 0; /* terminate it */
  return ns;
}